

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O1

void InstructionSet::M68k::Primitive::
     shift<(InstructionSet::M68k::Operation)79,unsigned_int,CPU::MC68000::ProcessorBase>
               (uint32_t source,uint *destination,Status *status,ProcessorBase *flow_controller)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = source & 0x3f;
  flow_controller->dynamic_instruction_length_ = uVar3 + 2;
  if (uVar3 == 0) {
    status->overflow_flag = 0;
    status->carry_flag = 0;
  }
  else {
    if (uVar3 < 0x21) {
      uVar1 = (ulong)(*destination << ((byte)uVar3 - 1 & 0x1f) & 0x80000000);
      status->extend_flag = uVar1;
      status->carry_flag = uVar1;
    }
    else {
      status->carry_flag = 0;
      status->extend_flag = 0;
    }
    status->overflow_flag = 0;
    uVar2 = 0;
    if (uVar3 < 0x20) {
      uVar2 = *destination << ((byte)uVar3 & 0x1f);
    }
    *destination = uVar2;
  }
  uVar3 = *destination;
  status->zero_result = (ulong)uVar3;
  status->negative_flag = (ulong)(uVar3 & 0x80000000);
  return;
}

Assistant:

int shift_count(uint8_t source, FlowController &flow_controller) {
	const int count = source & 63;
	flow_controller.template did_shift<IntT>(count);
	return count;
}